

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

void __thiscall create::Packet::setDataToValidate(Packet *this,uint16_t *tmp)

{
  std::mutex::lock(&this->tmpDataMutex);
  this->tmpData = *tmp;
  pthread_mutex_unlock((pthread_mutex_t *)&this->tmpDataMutex);
  return;
}

Assistant:

void Packet::setDataToValidate(const uint16_t& tmp) {
    std::lock_guard<std::mutex> lock(tmpDataMutex);
    tmpData = tmp;
  }